

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

int Parser_LoadDocument(IXML_Document **retDoc,char *xmlFileName,int file)

{
  Parser *xmlParser_00;
  Parser *xmlParser;
  int rc;
  int file_local;
  char *xmlFileName_local;
  IXML_Document **retDoc_local;
  
  xmlParser_00 = Parser_init();
  if (xmlParser_00 == (Parser *)0x0) {
    retDoc_local._4_4_ = 0x66;
  }
  else {
    retDoc_local._4_4_ = Parser_readFileOrBuffer(xmlParser_00,xmlFileName,file);
    if (retDoc_local._4_4_ == 0) {
      xmlParser_00->curPtr = xmlParser_00->dataBuffer;
      retDoc_local._4_4_ = Parser_parseDocument(retDoc,xmlParser_00);
    }
    else {
      Parser_free(xmlParser_00);
    }
  }
  return retDoc_local._4_4_;
}

Assistant:

int Parser_LoadDocument(
	/*! [out] The output document tree. */
	IXML_Document **retDoc,
	/*! [in] The file name or the buffer to copy, according to the
	 * parameter "file". */
	const char *xmlFileName,
	/*! [in] 1 if you want to read from a file, 0 if xmlFileName is
	 * the buffer to copy to the parser. */
	int file)
{
	int rc = IXML_SUCCESS;
	Parser *xmlParser = NULL;

	xmlParser = Parser_init();
	if (xmlParser == NULL) {
		return IXML_INSUFFICIENT_MEMORY;
	}

	rc = Parser_readFileOrBuffer(xmlParser, xmlFileName, file);
	if (rc != IXML_SUCCESS) {
		Parser_free(xmlParser);
		return rc;
	}

	xmlParser->curPtr = xmlParser->dataBuffer;
	rc = Parser_parseDocument(retDoc, xmlParser);
	return rc;
}